

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins_exts.c
# Opt level: O0

LY_ERR lyplg_ext_sprinter_ptree_add_ext_nodes
                 (lyspr_tree_ctx *ctx,lysp_ext_instance *ext,
                 lyplg_ext_sprinter_ptree_override_clb clb)

{
  ly_stmt lVar1;
  lysp_node *nodes;
  void **local_48;
  lysp_node *schema;
  uint32_t i;
  LY_ERR rc;
  lyplg_ext_sprinter_ptree_override_clb clb_local;
  lysp_ext_instance *ext_local;
  lyspr_tree_ctx *ctx_local;
  
  if (ctx == (lyspr_tree_ctx *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","ctx",
           "lyplg_ext_sprinter_ptree_add_ext_nodes");
    ctx_local._4_4_ = LY_EINVAL;
  }
  else if (ext == (lysp_ext_instance *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","ext",
           "lyplg_ext_sprinter_ptree_add_ext_nodes");
    ctx_local._4_4_ = LY_EINVAL;
  }
  else {
    schema._0_4_ = 0;
    while( true ) {
      if (ext->substmts == (lysp_ext_substmt *)0x0) {
        local_48 = (void **)0x0;
      }
      else {
        local_48 = ext->substmts[-1].storage_p;
      }
      if (local_48 <= (void **)(ulong)(uint)schema) {
        return LY_SUCCESS;
      }
      lVar1 = ext->substmts[(uint)schema].stmt;
      if ((((((lVar1 - LY_STMT_NOTIFICATION < 2) || (lVar1 == LY_STMT_OUTPUT)) ||
            (lVar1 == LY_STMT_ACTION)) ||
           ((((lVar1 == LY_STMT_RPC || (lVar1 == LY_STMT_ANYDATA)) ||
             ((lVar1 == LY_STMT_ANYXML || ((lVar1 == LY_STMT_CASE || (lVar1 == LY_STMT_CHOICE))))))
            || (lVar1 == LY_STMT_CONTAINER)))) ||
          (((lVar1 == LY_STMT_LEAF || (lVar1 == LY_STMT_LEAF_LIST)) || (lVar1 == LY_STMT_LIST)))) &&
         (nodes = (lysp_node *)*ext->substmts[(uint)schema].storage_p, nodes != (lysp_node *)0x0))
      break;
      schema._0_4_ = (uint)schema + 1;
    }
    ctx_local._4_4_ = lyplg_ext_sprinter_ptree_add_nodes(ctx,nodes,clb);
  }
  return ctx_local._4_4_;
}

Assistant:

LIBYANG_API_DECL LY_ERR
lyplg_ext_sprinter_ptree_add_ext_nodes(const struct lyspr_tree_ctx *ctx, struct lysp_ext_instance *ext,
        lyplg_ext_sprinter_ptree_override_clb clb)
{
    LY_ERR rc = LY_SUCCESS;
    uint32_t i;
    struct lysp_node *schema;

    LY_CHECK_ARG_RET(NULL, ctx, ext, LY_EINVAL);

    LY_ARRAY_FOR(ext->substmts, i) {
        switch (ext->substmts[i].stmt) {
        case LY_STMT_NOTIFICATION:
        case LY_STMT_INPUT:
        case LY_STMT_OUTPUT:
        case LY_STMT_ACTION:
        case LY_STMT_RPC:
        case LY_STMT_ANYDATA:
        case LY_STMT_ANYXML:
        case LY_STMT_CASE:
        case LY_STMT_CHOICE:
        case LY_STMT_CONTAINER:
        case LY_STMT_LEAF:
        case LY_STMT_LEAF_LIST:
        case LY_STMT_LIST:
            schema = *ext->substmts[i].storage_p;
            if (schema) {
                rc = lyplg_ext_sprinter_ptree_add_nodes(ctx, schema, clb);
                return rc;
            }
        default:
            break;
        }
    }

    return rc;
}